

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O3

bool cmsys::SystemTools::StringStartsWith(string *str1,char *str2)

{
  ulong uVar1;
  int iVar2;
  size_t __n;
  bool bVar3;
  
  if (str2 != (char *)0x0) {
    uVar1 = str1->_M_string_length;
    __n = strlen(str2);
    if (uVar1 < __n) {
      bVar3 = false;
    }
    else {
      iVar2 = strncmp((str1->_M_dataplus)._M_p,str2,__n);
      bVar3 = iVar2 == 0;
    }
    return bVar3;
  }
  return false;
}

Assistant:

bool SystemTools::StringStartsWith(const std::string& str1, const char* str2)
{
  if (!str2)
    {
    return false;
    }
  size_t len1 = str1.size(), len2 = strlen(str2);
  return len1 >= len2 && !strncmp(str1.c_str(), str2, len2) ? true : false;
}